

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

void __thiscall
FIX::RequiredTagMissing::RequiredTagMissing(RequiredTagMissing *this,int field,string *what)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  size_type *psVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  __val = -field;
  if (0 < field) {
    __val = field;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00164b92;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00164b92;
      }
      if (uVar3 < 10000) goto LAB_00164b92;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00164b92:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(field >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)field >> 0x1f) + (long)local_70[0]),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1c79c7);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar2[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_50._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  FIX::Exception::Exception(&this->super_Exception,&local_50,what);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f87b0;
  this->field = field;
  return;
}

Assistant:

RequiredTagMissing(int field = 0, const std::string &what = "")
      : Exception("Required tag missing: " + std::to_string(field), what),
        field(field) {}